

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O1

void * background_thread_entry(void *ind_arg)

{
  background_thread_info_t *info;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  _Bool _Var3;
  int iVar4;
  tsd_t *tsd;
  pthread_mutex_t *__mutex;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_024e0b60);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,true);
  }
  duckdb_je_tsd_state_set(tsd,'\x05');
  info = duckdb_je_background_thread_info + ((ulong)ind_arg & 0xffffffff);
  __mutex = (pthread_mutex_t *)
            ((long)&duckdb_je_background_thread_info[(ulong)ind_arg & 0xffffffff].mtx.field_0 + 0x48
            );
  iVar4 = pthread_mutex_trylock(__mutex);
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&info->mtx);
    (info->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(info->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if (&((info->mtx).field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    *(tsd_t **)((long)&(info->mtx).field_0 + 0x30) = tsd;
    ppwVar2 = &(info->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  (info->indefinite_sleep).repr = true;
  duckdb_je_nstime_init(&info->next_wakeup,0xffffffffffffffff);
  if ((uint)ind_arg == 0) {
    background_thread0_work(tsd);
  }
  else {
    while (info->state != background_thread_stopped) {
      _Var3 = background_thread_pause_check((tsdn_t *)tsd,info);
      if (!_Var3) {
        background_work_sleep_once((tsdn_t *)tsd,info,(uint)ind_arg);
      }
    }
  }
  (info->indefinite_sleep).repr = false;
  duckdb_je_nstime_init(&info->next_wakeup,0);
  (info->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return (void *)0x0;
}

Assistant:

static void *
background_thread_entry(void *ind_arg) {
	unsigned thread_ind = (unsigned)(uintptr_t)ind_arg;
	assert(thread_ind < max_background_threads);
#ifdef JEMALLOC_HAVE_PTHREAD_SETNAME_NP
	pthread_setname_np(pthread_self(), "jemalloc_bg_thd");
#elif defined(JEMALLOC_HAVE_PTHREAD_SET_NAME_NP)
	pthread_set_name_np(pthread_self(), "jemalloc_bg_thd");
#endif
	if (opt_percpu_arena != percpu_arena_disabled) {
		set_current_thread_affinity((int)thread_ind);
	}
	/*
	 * Start periodic background work.  We use internal tsd which avoids
	 * side effects, for example triggering new arena creation (which in
	 * turn triggers another background thread creation).
	 */
	background_work(tsd_internal_fetch(), thread_ind);
	assert(pthread_equal(pthread_self(),
	    background_thread_info[thread_ind].thread));

	return NULL;
}